

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O2

bool __thiscall Corrade::Utility::Arguments::isSet(Arguments *this,string *key)

{
  Entry *pEVar1;
  bool *pbVar2;
  Debug *pDVar3;
  ostream *poVar4;
  Error EStack_48;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&EStack_48,
                 &this->_prefix,key);
  pEVar1 = find(this,(string *)&EStack_48);
  std::__cxx11::string::~string((string *)&EStack_48);
  if (pEVar1 == (Entry *)0x0) {
    poVar4 = Error::defaultOutput();
    Error::Error(&EStack_48,poVar4,(Flags)0x0);
    pDVar3 = Debug::operator<<(&EStack_48.super_Debug,"Utility::Arguments::isSet(): key");
    pDVar3 = Implementation::debugPrintStlString(pDVar3,key);
    Debug::operator<<(pDVar3,"not found");
  }
  else if (pEVar1->type == BooleanOption) {
    if (pEVar1->id < (this->_booleans)._size) {
      if ((char)(this->_flags)._value < '\0') {
        pbVar2 = Containers::Array<bool,_void_(*)(bool_*,_unsigned_long)>::
                 operator[]<unsigned_long,_0>(&this->_booleans,pEVar1->id);
        return *pbVar2;
      }
      poVar4 = Error::defaultOutput();
      Error::Error(&EStack_48,poVar4,(Flags)0x0);
      Debug::operator<<(&EStack_48.super_Debug,
                        "Utility::Arguments::isSet(): arguments were not successfully parsed yet");
    }
    else {
      poVar4 = Error::defaultOutput();
      Error::Error(&EStack_48,poVar4,(Flags)0x0);
      Debug::operator<<(&EStack_48.super_Debug,
                        "Assertion found->id < _booleans.size() failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Arguments.cpp:1158"
                       );
    }
  }
  else {
    poVar4 = Error::defaultOutput();
    Error::Error(&EStack_48,poVar4,(Flags)0x0);
    pDVar3 = Debug::operator<<(&EStack_48.super_Debug,
                               "Utility::Arguments::isSet(): cannot use this function for a non-boolean option"
                              );
    operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pDVar3,key);
  }
  Error::~Error(&EStack_48);
  abort();
}

Assistant:

bool Arguments::isSet(const std::string& key) const {
    const Entry* found = find(_prefix + key);
    CORRADE_ASSERT(found, "Utility::Arguments::isSet(): key" << key << "not found", false);
    CORRADE_ASSERT(found->type == Type::BooleanOption,
        "Utility::Arguments::isSet(): cannot use this function for a non-boolean option" << key, false);
    CORRADE_INTERNAL_ASSERT(found->id < _booleans.size());
    CORRADE_ASSERT(_flags & InternalFlag::Parsed, "Utility::Arguments::isSet(): arguments were not successfully parsed yet", {});
    return _booleans[found->id];
}